

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_file_system.cpp
# Opt level: O2

int64_t __thiscall
duckdb::CompressedFile::ReadData(CompressedFile *this,void *buffer,int64_t remaining)

{
  data_ptr_t *ppdVar1;
  unique_ptr<duckdb::StreamWrapper,_std::default_delete<duckdb::StreamWrapper>,_true> *this_00;
  _Head_base<0UL,_unsigned_char_*,_false> _Var2;
  _Head_base<0UL,_duckdb::StreamWrapper_*,_false> _Var3;
  int iVar4;
  pointer pFVar5;
  int extraout_var;
  int extraout_var_00;
  pointer pSVar6;
  int64_t iVar7;
  data_ptr_t pdVar8;
  ulong __n;
  size_t __n_00;
  data_ptr_t pdVar9;
  
  this_00 = &this->stream_wrapper;
  iVar7 = 0;
  do {
    pdVar9 = (this->stream_data).out_buff_start;
    pdVar8 = (this->stream_data).out_buff_end;
    if (pdVar9 != pdVar8) {
      __n = (long)pdVar8 - (long)pdVar9;
      if ((ulong)remaining < __n) {
        __n = remaining;
      }
      switchD_00916250::default((void *)((long)buffer + iVar7),pdVar9,__n);
      ppdVar1 = &(this->stream_data).out_buff_start;
      *ppdVar1 = *ppdVar1 + __n;
      iVar7 = iVar7 + __n;
      remaining = remaining - __n;
      if (remaining == 0) {
        return iVar7;
      }
    }
    if ((this_00->
        super_unique_ptr<duckdb::StreamWrapper,_std::default_delete<duckdb::StreamWrapper>_>)._M_t.
        super___uniq_ptr_impl<duckdb::StreamWrapper,_std::default_delete<duckdb::StreamWrapper>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::StreamWrapper_*,_std::default_delete<duckdb::StreamWrapper>_>
        .super__Head_base<0UL,_duckdb::StreamWrapper_*,_false>._M_head_impl == (StreamWrapper *)0x0)
    {
      return iVar7;
    }
    pdVar9 = (this->stream_data).in_buff_end;
    pdVar8 = (this->stream_data).in_buff_start;
    __n_00 = (long)pdVar9 - (long)pdVar8;
    this->current_position = this->current_position + __n_00;
    _Var2._M_head_impl =
         (this->stream_data).out_buff.
         super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (this->stream_data).out_buff_start = _Var2._M_head_impl;
    (this->stream_data).out_buff_end = _Var2._M_head_impl;
    if (((this->stream_data).refresh == true) &&
       (_Var2._M_head_impl =
             (this->stream_data).in_buff.
             super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
       pdVar9 == _Var2._M_head_impl + (this->stream_data).in_buf_size)) {
      memmove(_Var2._M_head_impl,pdVar8,__n_00);
      (this->stream_data).in_buff_start =
           (this->stream_data).in_buff.
           super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      pFVar5 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator->(&this->child_handle);
      iVar4 = (*pFVar5->file_system->_vptr_FileSystem[5])
                        (pFVar5->file_system,pFVar5,(this->stream_data).in_buff_start + __n_00,
                         (this->stream_data).in_buf_size - __n_00);
      pdVar8 = (this->stream_data).in_buff_start;
      pdVar9 = pdVar8 + CONCAT44(extraout_var,iVar4) + __n_00;
      (this->stream_data).in_buff_end = pdVar9;
      if (CONCAT44(extraout_var,iVar4) == 0 || extraout_var < 0) goto LAB_00320e89;
    }
    if (pdVar8 == pdVar9) {
      _Var2._M_head_impl =
           (this->stream_data).in_buff.
           super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      (this->stream_data).in_buff_start = _Var2._M_head_impl;
      (this->stream_data).in_buff_end = _Var2._M_head_impl;
      pFVar5 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator->(&this->child_handle);
      iVar4 = (*pFVar5->file_system->_vptr_FileSystem[5])
                        (pFVar5->file_system,pFVar5,
                         (this->stream_data).in_buff.
                         super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                         (this->stream_data).in_buf_size);
      if (CONCAT44(extraout_var_00,iVar4) == 0 || extraout_var_00 < 0) {
LAB_00320e89:
        _Var3._M_head_impl =
             (this_00->
             super_unique_ptr<duckdb::StreamWrapper,_std::default_delete<duckdb::StreamWrapper>_>).
             _M_t.
             super___uniq_ptr_impl<duckdb::StreamWrapper,_std::default_delete<duckdb::StreamWrapper>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::StreamWrapper_*,_std::default_delete<duckdb::StreamWrapper>_>
             .super__Head_base<0UL,_duckdb::StreamWrapper_*,_false>._M_head_impl;
        (this_00->
        super_unique_ptr<duckdb::StreamWrapper,_std::default_delete<duckdb::StreamWrapper>_>)._M_t.
        super___uniq_ptr_impl<duckdb::StreamWrapper,_std::default_delete<duckdb::StreamWrapper>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::StreamWrapper_*,_std::default_delete<duckdb::StreamWrapper>_>
        .super__Head_base<0UL,_duckdb::StreamWrapper_*,_false>._M_head_impl = (StreamWrapper *)0x0;
        if (_Var3._M_head_impl != (StreamWrapper *)0x0) {
          (*(_Var3._M_head_impl)->_vptr_StreamWrapper[1])();
        }
        return iVar7;
      }
      (this->stream_data).in_buff_end =
           (this->stream_data).in_buff_start + CONCAT44(extraout_var_00,iVar4);
    }
    pSVar6 = unique_ptr<duckdb::StreamWrapper,_std::default_delete<duckdb::StreamWrapper>,_true>::
             operator->(this_00);
    iVar4 = (*pSVar6->_vptr_StreamWrapper[3])(pSVar6,&this->stream_data);
    if ((char)iVar4 != '\0') {
      _Var3._M_head_impl =
           (this_00->
           super_unique_ptr<duckdb::StreamWrapper,_std::default_delete<duckdb::StreamWrapper>_>).
           _M_t.
           super___uniq_ptr_impl<duckdb::StreamWrapper,_std::default_delete<duckdb::StreamWrapper>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::StreamWrapper_*,_std::default_delete<duckdb::StreamWrapper>_>
           .super__Head_base<0UL,_duckdb::StreamWrapper_*,_false>._M_head_impl;
      (this_00->super_unique_ptr<duckdb::StreamWrapper,_std::default_delete<duckdb::StreamWrapper>_>
      )._M_t.
      super___uniq_ptr_impl<duckdb::StreamWrapper,_std::default_delete<duckdb::StreamWrapper>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::StreamWrapper_*,_std::default_delete<duckdb::StreamWrapper>_>.
      super__Head_base<0UL,_duckdb::StreamWrapper_*,_false>._M_head_impl = (StreamWrapper *)0x0;
      if (_Var3._M_head_impl != (StreamWrapper *)0x0) {
        (*(_Var3._M_head_impl)->_vptr_StreamWrapper[1])();
      }
    }
  } while( true );
}

Assistant:

int64_t CompressedFile::ReadData(void *buffer, int64_t remaining) {
	idx_t total_read = 0;
	while (true) {
		// first check if there are input bytes available in the output buffers
		if (stream_data.out_buff_start != stream_data.out_buff_end) {
			// there is! copy it into the output buffer
			auto available =
			    MinValue<idx_t>(UnsafeNumericCast<idx_t>(remaining),
			                    UnsafeNumericCast<idx_t>(stream_data.out_buff_end - stream_data.out_buff_start));
			memcpy(static_cast<data_ptr_t>(buffer) + total_read, stream_data.out_buff_start, available);

			// increment the total read variables as required
			stream_data.out_buff_start += available;
			total_read += available;
			remaining = UnsafeNumericCast<int64_t>(UnsafeNumericCast<idx_t>(remaining) - available);
			if (remaining == 0) {
				// done! read enough
				return UnsafeNumericCast<int64_t>(total_read);
			}
		}
		if (!stream_wrapper) {
			return UnsafeNumericCast<int64_t>(total_read);
		}
		current_position += static_cast<idx_t>(stream_data.in_buff_end - stream_data.in_buff_start);
		// ran out of buffer: read more data from the child stream
		stream_data.out_buff_start = stream_data.out_buff.get();
		stream_data.out_buff_end = stream_data.out_buff.get();
		D_ASSERT(stream_data.in_buff_start <= stream_data.in_buff_end);
		D_ASSERT(stream_data.in_buff_end <= stream_data.in_buff_start + stream_data.in_buf_size);

		// read more input when requested and still data in the input stream
		if (stream_data.refresh && (stream_data.in_buff_end == stream_data.in_buff.get() + stream_data.in_buf_size)) {
			auto bufrem = stream_data.in_buff_end - stream_data.in_buff_start;
			// buffer not empty, move remaining bytes to the beginning
			memmove(stream_data.in_buff.get(), stream_data.in_buff_start, UnsafeNumericCast<size_t>(bufrem));
			stream_data.in_buff_start = stream_data.in_buff.get();
			// refill the rest of input buffer
			auto sz = child_handle->Read(stream_data.in_buff_start + bufrem,
			                             stream_data.in_buf_size - UnsafeNumericCast<idx_t>(bufrem));
			stream_data.in_buff_end = stream_data.in_buff_start + bufrem + sz;
			if (sz <= 0) {
				stream_wrapper.reset();
				break;
			}
		}

		// read more input if none available
		if (stream_data.in_buff_start == stream_data.in_buff_end) {
			// empty input buffer: refill from the start
			stream_data.in_buff_start = stream_data.in_buff.get();
			stream_data.in_buff_end = stream_data.in_buff_start;
			auto sz = child_handle->Read(stream_data.in_buff.get(), stream_data.in_buf_size);
			if (sz <= 0) {
				stream_wrapper.reset();
				break;
			}
			stream_data.in_buff_end = stream_data.in_buff_start + sz;
		}

		auto finished = stream_wrapper->Read(stream_data);
		if (finished) {
			stream_wrapper.reset();
		}
	}
	return UnsafeNumericCast<int64_t>(total_read);
}